

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O0

int get_serverAtomicInt(void *fd,int *file_int_ptr,int byte_reversal)

{
  int iVar1;
  int in_EDX;
  undefined4 *in_RSI;
  void *in_RDI;
  char *junk_result_str;
  int junk_errno;
  int tmp_value;
  char *local_30;
  uint local_24;
  undefined4 local_20;
  int local_1c;
  undefined4 *local_18;
  int local_4;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  iVar1 = (*ffs_server_read_func)(in_RDI,&local_20,4,(int *)&local_24,&local_30);
  if (iVar1 == 4) {
    if (local_1c != 0) {
      byte_swap((char *)&local_20,4);
    }
    *local_18 = local_20;
    local_4 = 1;
  }
  else {
    printf("SERVER READ FAILED, ERRNO = %d\n",(ulong)local_24);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
get_serverAtomicInt(void *fd, FILE_INT *file_int_ptr, int byte_reversal)
{
#if SIZEOF_INT == 4
    int tmp_value;
    int junk_errno;
    char *junk_result_str;
    if (ffs_server_read_func(fd, &tmp_value, 4, &junk_errno, &junk_result_str) != 4) {
	printf("SERVER READ FAILED, ERRNO = %d\n", junk_errno);

	return 0;
    }
#else
    Baaad shit;
#endif
    if (byte_reversal)
	byte_swap((char *) &tmp_value, 4);
    *file_int_ptr = tmp_value;
    return 1;
}